

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O2

int GetHealthRequestRPLIDAR(RPLIDAR *pRPLIDAR,BOOL *pbProtectionStop)

{
  int iVar1;
  char *__s;
  int DataType;
  int DataResponseLength;
  uchar databuf [3];
  int SendMode;
  uchar reqbuf [2];
  
  DataResponseLength = 0;
  reqbuf[0] = 0xa5;
  reqbuf[1] = 'R';
  SendMode = 0;
  DataType = 0;
  iVar1 = WriteAllRS232Port(&pRPLIDAR->RS232Port,reqbuf,2);
  if (iVar1 == 0) {
    iVar1 = GetResponseDescriptorRPLIDAR(pRPLIDAR,&DataResponseLength,&SendMode,&DataType);
    if (iVar1 == 0) {
      if ((DataResponseLength == 3) && (DataType == 6)) {
        databuf[2] = '\0';
        databuf[0] = '\0';
        databuf[1] = '\0';
        iVar1 = ReadAllRS232Port(&pRPLIDAR->RS232Port,databuf,3);
        if (iVar1 == 0) {
          *pbProtectionStop = (uint)(databuf[0] == '\x02');
          return 0;
        }
        __s = "A RPLIDAR is not responding correctly. ";
      }
      else {
        __s = "A RPLIDAR is not responding correctly : Bad response descriptor. ";
      }
      puts(__s);
    }
  }
  else {
    puts("Error writing data to a RPLIDAR. ");
  }
  return 1;
}

Assistant:

inline int GetHealthRequestRPLIDAR(RPLIDAR* pRPLIDAR, BOOL* pbProtectionStop)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
    sl_lidar_response_device_health_t healthinfo;

	if (SL_IS_FAIL(pRPLIDAR->drv->getHealth(healthinfo)))
	{
		printf("A RPLIDAR is not responding correctly : getHealth() failed. \n");
		return EXIT_FAILURE;
	}

	// Analyze the data response.
	*pbProtectionStop = (healthinfo.status == SL_LIDAR_STATUS_ERROR)? TRUE: FALSE;
#else
	unsigned char reqbuf[] = {START_FLAG1_RPLIDAR,GET_HEALTH_REQUEST_RPLIDAR};
	unsigned char databuf[3];
	int DataResponseLength = 0, SendMode = 0, DataType = 0;

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}

	// Receive the response descriptor.
	if (GetResponseDescriptorRPLIDAR(pRPLIDAR, &DataResponseLength, &SendMode, &DataType) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Quick check of the response descriptor.
	if ((DataResponseLength != 3)||(DataType != DEVHEALTH_RESPONSE_RPLIDAR))
	{ 
		printf("A RPLIDAR is not responding correctly : Bad response descriptor. \n");
		return EXIT_FAILURE;	
	}

	// Receive the data response.
	memset(databuf, 0, sizeof(databuf));
	if (ReadAllRS232Port(&pRPLIDAR->RS232Port, databuf, sizeof(databuf)) != EXIT_SUCCESS)
	{ 
		printf("A RPLIDAR is not responding correctly. \n");
		return EXIT_FAILURE;	
	}

	// Analyze the data response.
	*pbProtectionStop = (databuf[0] == STATUS_ERROR_RPLIDAR)? TRUE: FALSE;
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}